

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int CVodeGetNumLinConvFails(void *cvode_mem,long *nlcfails)

{
  undefined8 *in_RSI;
  int retval;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVodeMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = cvLs_AccessLMem(in_stack_ffffffffffffffd8,
                            (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8,(CVLsMem *)0x13c989);
  if (local_4 == 0) {
    *in_RSI = *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0xb8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetNumLinConvFails(void* cvode_mem, long int* nlcfails)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure; set output value and return */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }
  *nlcfails = cvls_mem->ncfl;
  return (CVLS_SUCCESS);
}